

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O2

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1>::set_options
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)1> *this,
          unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *str)

{
  long lVar1;
  
  lVar1 = __dynamic_cast((str->_M_t).
                         super___uniq_ptr_impl<Reflection::Struct,_std::default_delete<Reflection::Struct>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Reflection::Struct_*,_std::default_delete<Reflection::Struct>_>
                         .super__Head_base<0UL,_Reflection::Struct_*,_false>._M_head_impl,
                         &Reflection::Struct::typeinfo,&Macintosh::Machine::Options::typeinfo,0);
  this->quickboot_ = *(bool *)(lVar1 + 8);
  return;
}

Assistant:

void set_options(const std::unique_ptr<Reflection::Struct> &str) final {
			// TODO: should this really be a runtime option?
			// It should probably be a construction option.

			const auto options = dynamic_cast<Options *>(str.get());
			quickboot_ = options->quickboot;

			using Model = Analyser::Static::Macintosh::Target::Model;
			const bool is_plus_rom = model == Model::Mac512ke || model == Model::MacPlus;
			if(quickboot_ && is_plus_rom) {
				// Cf. Big Mess o' Wires' disassembly of the Mac Plus ROM, and the
				// test at $E00. TODO: adapt as(/if?) necessary for other Macs.
				ram_[0x02ae] = 0x40;
				ram_[0x02af] = 0x00;
				ram_[0x02b0] = 0x00;
				ram_[0x02b1] = 0x00;
			}
		}